

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void __thiscall edition_unittest::TestCamelCaseFieldNames::Clear(TestCamelCaseFieldNames *this)

{
  RepeatedField<int> *pRVar1;
  ulong uVar2;
  ForeignMessage *this_00;
  anon_union_192_1_493b367e_for_TestCamelCaseFieldNames_3 aVar3;
  int iVar4;
  undefined8 *puVar5;
  char *failure_msg;
  char *file;
  bool bVar6;
  LogMessageFatal local_30;
  
  pRVar1 = &(this->field_0)._impl_.repeatedprimitivefield_;
  aVar3 = this->field_0;
  if (((undefined1  [192])aVar3 & (undefined1  [192])0x4) != (undefined1  [192])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar6 = ((undefined1  [192])aVar3 & (undefined1  [192])0x4) == (undefined1  [192])0x0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size
            (pRVar1,((undefined1  [192])aVar3 & (undefined1  [192])0x4) == (undefined1  [192])0x0,0)
  ;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeatedstringfield_.super_RepeatedPtrFieldBase);
  pRVar1 = &(this->field_0)._impl_.repeatedenumfield_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x38);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar6 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>>
            (&(this->field_0)._impl_.repeatedmessagefield_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeatedstringpiecefield_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeatedcordfield_.super_RepeatedPtrFieldBase);
  aVar3 = this->field_0;
  if (((undefined1  [192])aVar3 & (undefined1  [192])0xf) == (undefined1  [192])0x0)
  goto LAB_00c302d7;
  if (((undefined1  [192])aVar3 & (undefined1  [192])0x1) != (undefined1  [192])0x0) {
    uVar2 = *(ulong *)((long)&this->field_0 + 0x98);
    if ((uVar2 & 3) != 0) {
      puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      puVar5[1] = 0;
      *(undefined1 *)*puVar5 = 0;
      goto LAB_00c30276;
    }
LAB_00c3031c:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
    ;
    failure_msg = "!tagged_ptr_.IsDefault()";
    iVar4 = 0x20b;
LAB_00c30354:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_30,file,iVar4,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
  }
LAB_00c30276:
  if (((undefined1  [192])aVar3 & (undefined1  [192])0x2) != (undefined1  [192])0x0) {
    uVar2 = *(ulong *)((long)&this->field_0 + 0xa0);
    if ((uVar2 & 3) == 0) goto LAB_00c3031c;
    puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    puVar5[1] = 0;
    *(undefined1 *)*puVar5 = 0;
  }
  if (((undefined1  [192])aVar3 & (undefined1  [192])0x4) != (undefined1  [192])0x0) {
    uVar2 = *(ulong *)((long)&this->field_0 + 0xa8);
    if ((uVar2 & 3) == 0) goto LAB_00c3031c;
    puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    puVar5[1] = 0;
    *(undefined1 *)*puVar5 = 0;
  }
  if (((undefined1  [192])aVar3 & (undefined1  [192])0x8) != (undefined1  [192])0x0) {
    this_00 = (this->field_0)._impl_.messagefield_;
    if (this_00 == (ForeignMessage *)0x0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.cc"
      ;
      failure_msg = "_impl_.messagefield_ != nullptr";
      iVar4 = 0x690b;
      goto LAB_00c30354;
    }
    ForeignMessage::Clear(this_00);
  }
LAB_00c302d7:
  if (((undefined1  [192])aVar3 & (undefined1  [192])0x30) != (undefined1  [192])0x0) {
    *(undefined8 *)((long)&this->field_0 + 0xb8) = 0x400000000;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestCamelCaseFieldNames::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestCamelCaseFieldNames)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeatedprimitivefield_.Clear();
  _impl_.repeatedstringfield_.Clear();
  _impl_.repeatedenumfield_.Clear();
  _impl_.repeatedmessagefield_.Clear();
  _impl_.repeatedstringpiecefield_.Clear();
  _impl_.repeatedcordfield_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.stringfield_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.stringpiecefield_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.cordfield_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.messagefield_ != nullptr);
      _impl_.messagefield_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000030u) != 0) {
    _impl_.primitivefield_ = 0;
    _impl_.enumfield_ = 4;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}